

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

ParseInfoTree * __thiscall
google::protobuf::TextFormat::ParseInfoTree::CreateNested
          (ParseInfoTree *this,FieldDescriptor *field)

{
  iterator __position;
  ParseInfoTree *this_00;
  vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>
  *this_01;
  ParseInfoTree *instance;
  ParseInfoTree *local_20;
  FieldDescriptor *local_18;
  
  local_18 = field;
  this_00 = (ParseInfoTree *)operator_new(0x60);
  ParseInfoTree(this_00);
  local_20 = this_00;
  this_01 = (vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>
             *)std::
               map<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>_>_>
               ::operator[](&this->nested_,&local_18);
  __position._M_current = *(ParseInfoTree ***)(this_01 + 8);
  if (__position._M_current == *(ParseInfoTree ***)(this_01 + 0x10)) {
    std::
    vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>
    ::_M_realloc_insert<google::protobuf::TextFormat::ParseInfoTree*const&>
              (this_01,__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
  }
  return local_20;
}

Assistant:

TextFormat::ParseInfoTree* TextFormat::ParseInfoTree::CreateNested(
    const FieldDescriptor* field) {
  // Owned by us in the map.
  TextFormat::ParseInfoTree* instance = new TextFormat::ParseInfoTree();
  std::vector<TextFormat::ParseInfoTree*>* trees = &nested_[field];
  GOOGLE_CHECK(trees);
  trees->push_back(instance);
  return instance;
}